

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safeint.h
# Opt level: O0

SafeInt<int> mp::operator+(SafeInt<int> a,SafeInt<int> b)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  SafeInt<int> in_ESI;
  SafeInt<int> in_EDI;
  int b_value;
  int a_value;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  SafeInt<int> local_4;
  
  iVar2 = val(in_EDI);
  iVar3 = val(in_ESI);
  bVar1 = fmt::internal::is_negative<int>(0);
  if (bVar1) {
    iVar4 = iVar3;
    iVar5 = std::numeric_limits<int>::min();
    if (iVar4 < iVar5 - iVar2) {
      pvVar6 = (void *)__cxa_allocate_exception(8);
      memset(pvVar6,0,8);
      OverflowError::OverflowError((OverflowError *)CONCAT44(iVar4,in_stack_ffffffffffffffd0));
      __cxa_throw(pvVar6,&OverflowError::typeinfo,OverflowError::~OverflowError);
    }
  }
  else {
    iVar4 = std::numeric_limits<int>::max();
    if (iVar4 - iVar2 < iVar3) {
      pvVar6 = (void *)__cxa_allocate_exception(8);
      memset(pvVar6,0,8);
      OverflowError::OverflowError
                ((OverflowError *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      __cxa_throw(pvVar6,&OverflowError::typeinfo,OverflowError::~OverflowError);
    }
  }
  SafeInt<int>::SafeInt(&local_4,iVar2 + iVar3);
  return (SafeInt<int>)local_4.value_;
}

Assistant:

inline SafeInt<T> operator+(SafeInt<T> a, SafeInt<T> b) {
  T a_value = val(a), b_value = val(b);
  if (!fmt::internal::is_negative(a_value)) {
    if (b_value > std::numeric_limits<T>::max() - a_value)
      throw OverflowError();
  } else if (b_value < std::numeric_limits<T>::min() - a_value)
    throw OverflowError();
  return a_value + b_value;
}